

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_hash_table.hpp
# Opt level: O0

bool __thiscall
poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::set
          (standard_hash_table<80U,_poplar::hash::vigna_hasher> *this,uint64_t key,uint64_t val)

{
  bool bVar1;
  reference pvVar2;
  standard_hash_table<80U,_poplar::hash::vigna_hasher> *in_RDX;
  uint64_t in_RSI;
  vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  *in_RDI;
  uint64_t i;
  standard_hash_table<80U,_poplar::hash::vigna_hasher> *in_stack_ffffffffffffff78;
  standard_hash_table<80U,_poplar::hash::vigna_hasher> *in_stack_ffffffffffffff80;
  standard_hash_table<80U,_poplar::hash::vigna_hasher> *in_stack_ffffffffffffff90;
  size_type local_60;
  uint32_t in_stack_ffffffffffffffac;
  standard_hash_table<80U,_poplar::hash::vigna_hasher> *in_stack_ffffffffffffffb0;
  
  bVar1 = std::
          vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
          ::empty(&in_stack_ffffffffffffff90->table_);
  if (bVar1) {
    standard_hash_table(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    ~standard_hash_table((standard_hash_table<80U,_poplar::hash::vigna_hasher> *)0x13cf23);
  }
  if (in_RDI[1].
      super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
      ._M_impl.super__Vector_impl_data._M_finish <=
      in_RDI[1].
      super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    expand_(in_RDX);
  }
  local_60 = init_id_(in_stack_ffffffffffffff90,(uint64_t)in_RDI);
  while( true ) {
    pvVar2 = std::
             vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
             ::operator[](in_RDI,local_60);
    if (pvVar2->key == 0xffffffffffffffff) {
      pvVar2 = std::
               vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
               ::operator[](in_RDI,local_60);
      pvVar2->key = in_RSI;
      pvVar2->val = (uint64_t)in_RDX;
      in_RDI[1].
      super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)&(in_RDI[1].
                             super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
                             ._M_impl.super__Vector_impl_data._M_start)->key + 1);
      return true;
    }
    pvVar2 = std::
             vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
             ::operator[](in_RDI,local_60);
    if (pvVar2->key == in_RSI) break;
    local_60 = right_(in_stack_ffffffffffffff80,(uint64_t)in_stack_ffffffffffffff78);
  }
  pvVar2 = std::
           vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
           ::operator[](in_RDI,local_60);
  pvVar2->val = (uint64_t)in_RDX;
  return false;
}

Assistant:

bool set(uint64_t key, uint64_t val) {
        if (table_.empty()) {
            *this = this_type(min_capa_bits);
        }

        if (max_size_ <= size_) {
            expand_();
        }

        for (uint64_t i = init_id_(key);; i = right_(i)) {
            if (table_[i].key == UINT64_MAX) {
                table_[i] = {key, val};
                ++size_;
                return true;
            }
            if (table_[i].key == key) {
                table_[i].val = val;
                return false;
            }
        }
    }